

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O3

void __thiscall Assimp::ObjExporter::AddNode(ObjExporter *this,aiNode *nd,aiMatrix4x4 *mParent)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  aiMesh *m;
  aiNode *name;
  ulong uVar29;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 local_78;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  uVar13 = mParent->a1;
  uVar14 = mParent->a2;
  uVar15 = mParent->a3;
  uVar16 = mParent->a4;
  uVar17 = mParent->b1;
  uVar18 = mParent->b2;
  uVar19 = mParent->b3;
  uVar20 = mParent->b4;
  uVar21 = mParent->c1;
  uVar22 = mParent->c2;
  uVar23 = mParent->c3;
  uVar24 = mParent->c4;
  uVar25 = mParent->d1;
  uVar26 = mParent->d2;
  uVar27 = mParent->d3;
  uVar28 = mParent->d4;
  local_38 = (nd->mTransformation).a1;
  fStack_34 = (nd->mTransformation).a2;
  fStack_30 = (nd->mTransformation).a3;
  fStack_2c = (nd->mTransformation).a4;
  fVar1 = (nd->mTransformation).b1;
  fVar2 = (nd->mTransformation).b2;
  fVar3 = (nd->mTransformation).b3;
  fVar4 = (nd->mTransformation).b4;
  fVar5 = (nd->mTransformation).c1;
  fVar6 = (nd->mTransformation).c2;
  fVar7 = (nd->mTransformation).c3;
  fVar8 = (nd->mTransformation).c4;
  fVar9 = (nd->mTransformation).d1;
  fVar10 = (nd->mTransformation).d2;
  fVar11 = (nd->mTransformation).d3;
  fVar12 = (nd->mTransformation).d4;
  local_78.a2 = (float)uVar16 * fVar10 +
                (float)uVar15 * fVar6 + (float)uVar13 * fStack_34 + (float)uVar14 * fVar2;
  local_78.a1 = (float)uVar16 * fVar9 +
                (float)uVar15 * fVar5 + (float)uVar13 * local_38 + (float)uVar14 * fVar1;
  local_78.a4 = (float)uVar16 * fVar12 +
                (float)uVar15 * fVar8 + (float)uVar13 * fStack_2c + (float)uVar14 * fVar4;
  local_78.a3 = (float)uVar16 * fVar11 +
                (float)uVar15 * fVar7 + (float)uVar13 * fStack_30 + (float)uVar14 * fVar3;
  local_78.b2 = (float)uVar20 * fVar10 +
                (float)uVar19 * fVar6 + (float)uVar17 * fStack_34 + (float)uVar18 * fVar2;
  local_78.b1 = (float)uVar20 * fVar9 +
                (float)uVar19 * fVar5 + (float)uVar17 * local_38 + (float)uVar18 * fVar1;
  local_78.b4 = (float)uVar20 * fVar12 +
                (float)uVar19 * fVar8 + (float)uVar17 * fStack_2c + (float)uVar18 * fVar4;
  local_78.b3 = (float)uVar20 * fVar11 +
                (float)uVar19 * fVar7 + (float)uVar17 * fStack_30 + (float)uVar18 * fVar3;
  local_78.c2 = (float)uVar24 * fVar10 +
                (float)uVar23 * fVar6 + (float)uVar21 * fStack_34 + (float)uVar22 * fVar2;
  local_78.c1 = (float)uVar24 * fVar9 +
                (float)uVar23 * fVar5 + (float)uVar21 * local_38 + (float)uVar22 * fVar1;
  local_78.c4 = (float)uVar24 * fVar12 +
                (float)uVar23 * fVar8 + (float)uVar21 * fStack_2c + (float)uVar22 * fVar4;
  local_78.c3 = (float)uVar24 * fVar11 +
                (float)uVar23 * fVar7 + (float)uVar21 * fStack_30 + (float)uVar22 * fVar3;
  local_78.d2 = (float)uVar28 * fVar10 +
                (float)uVar27 * fVar6 + (float)uVar25 * fStack_34 + (float)uVar26 * fVar2;
  local_78.d1 = (float)uVar28 * fVar9 +
                (float)uVar27 * fVar5 + (float)uVar25 * local_38 + (float)uVar26 * fVar1;
  local_78.d4 = (float)uVar28 * fVar12 +
                (float)uVar27 * fVar8 + (float)uVar25 * fStack_2c + (float)uVar26 * fVar4;
  local_78.d3 = (float)uVar28 * fVar11 +
                (float)uVar27 * fVar7 + (float)uVar25 * fStack_30 + (float)uVar26 * fVar3;
  if (nd->mNumMeshes != 0) {
    uVar29 = 0;
    do {
      m = this->pScene->mMeshes[nd->mMeshes[uVar29]];
      if (m == (aiMesh *)0x0) {
        m = (aiMesh *)0x0;
        name = nd;
      }
      else {
        name = (aiNode *)&m->mName;
      }
      AddMesh(this,&name->mName,m,&local_78);
      uVar29 = uVar29 + 1;
    } while (uVar29 < nd->mNumMeshes);
  }
  if (nd->mNumChildren != 0) {
    uVar29 = 0;
    do {
      AddNode(this,nd->mChildren[uVar29],&local_78);
      uVar29 = uVar29 + 1;
    } while (uVar29 < nd->mNumChildren);
  }
  return;
}

Assistant:

void ObjExporter::AddNode(const aiNode* nd, const aiMatrix4x4& mParent) {
    const aiMatrix4x4& mAbs = mParent * nd->mTransformation;

    aiMesh *cm( nullptr );
    for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
        cm = pScene->mMeshes[nd->mMeshes[i]];
        if (nullptr != cm) {
            AddMesh(cm->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        } else {
            AddMesh(nd->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        }
    }

    for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
        AddNode(nd->mChildren[i], mAbs);
    }
}